

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

Matrix4x4 * __thiscall
CMU462::DynamicScene::SceneObject::getRotation(Matrix4x4 *__return_storage_ptr__,SceneObject *this)

{
  Matrix4x4 local_258;
  Matrix4x4 local_1d8;
  Matrix4x4 local_158;
  Matrix4x4 local_d8;
  double local_58;
  double local_50;
  Vector3D local_48;
  undefined1 local_30 [8];
  Vector3D rot;
  SceneObject *this_local;
  
  local_50 = 3.141592653589793;
  rot.z = (double)this;
  Vector3D::operator*(&local_48,&this->rotation,&local_50);
  local_58 = 180.0;
  Vector3D::operator/((Vector3D *)local_30,&local_48,&local_58);
  Matrix4x4::rotation(&local_158,(double)local_30,X);
  Matrix4x4::rotation(&local_1d8,rot.x,Y);
  Matrix4x4::operator*(&local_d8,&local_158,&local_1d8);
  Matrix4x4::rotation(&local_258,rot.y,Z);
  Matrix4x4::operator*(__return_storage_ptr__,&local_d8,&local_258);
  return __return_storage_ptr__;
}

Assistant:

Matrix4x4 SceneObject::getRotation()
{
  Vector3D rot = rotation * M_PI / 180;
  return Matrix4x4::rotation(rot.x, Matrix4x4::Axis::X)
    * Matrix4x4::rotation(rot.y, Matrix4x4::Axis::Y)
    * Matrix4x4::rotation(rot.z, Matrix4x4::Axis::Z);
}